

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O3

string * toUpperCase(string *__return_storage_ptr__,string *name)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  size_type sVar4;
  int __c;
  bool bVar5;
  bool bVar6;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = name->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (name->_M_dataplus)._M_p;
    sVar4 = 0;
    bVar6 = false;
    bVar5 = false;
    do {
      __c = (int)pcVar2[sVar4];
      iVar3 = isupper(__c);
      if (((iVar3 != 0) && ((bool)(bVar5 | bVar6))) || ((bool)(__c - 0x30U < 10 & bVar6))) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,'_');
      }
      iVar3 = toupper(__c);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,(char)iVar3);
      iVar3 = islower(__c);
      bVar6 = iVar3 != 0;
      bVar5 = __c - 0x30U < 10;
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toUpperCase( std::string const & name )
{
  std::string convertedName;
  bool        previousIsLowerCase = false;
  bool        previousIsDigit     = false;
  for ( auto c : name )
  {
    if ( ( isupper( c ) && ( previousIsLowerCase || previousIsDigit ) ) || ( isdigit( c ) && previousIsLowerCase ) )
    {
      convertedName.push_back( '_' );
    }
    convertedName.push_back( static_cast<char>( toupper( c ) ) );
    previousIsLowerCase = !!islower( c );
    previousIsDigit     = !!isdigit( c );
  }
  return convertedName;
}